

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zap.c
# Opt level: O3

int dozap(obj *obj)

{
  int n;
  boolean bVar1;
  char dz_00;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char dy_00;
  schar dx_00;
  int iVar5;
  schar dz;
  schar dy;
  schar dx;
  char buf [256];
  schar local_12b;
  schar local_12a;
  schar local_129;
  char local_128 [264];
  
  local_129 = '\0';
  local_12a = '\0';
  local_12b = '\0';
  bVar1 = check_capacity((char *)0x0);
  if (bVar1 != '\0') {
    return 0;
  }
  if (obj == (obj *)0x0) {
    obj = getobj("\v","zap",(obj **)0x0);
    if (obj == (obj *)0x0) {
      return 0;
    }
  }
  else {
    bVar1 = validate_object(obj,"\v","zap");
    if (bVar1 == '\0') {
      return 0;
    }
  }
  check_unpaid(obj);
  iVar2 = zappable(obj);
  if (iVar2 != 0) {
    if (((obj->field_0x4a & 1) != 0) &&
       (uVar3 = mt_random(),
       (uVar3 * -0x11111111 >> 1 | (uint)((uVar3 * -0x11111111 & 1) != 0) << 0x1f) < 0x8888889)) {
      obj->field_0x4c = obj->field_0x4c | 0x80;
      pcVar4 = xname(obj);
      pcVar4 = The(pcVar4);
      pline("%s suddenly explodes!",pcVar4);
      iVar2 = obj->spe + 2;
      n = 0;
      for (iVar5 = iVar2; iVar5 != 0; iVar5 = iVar5 + -1) {
        uVar3 = mt_random();
        iVar2 = iVar2 + uVar3 % 6;
        n = iVar2;
      }
      losehp(n,"exploding wand",0);
      useup(obj);
      exercise(0,'\0');
      return 1;
    }
    if ((*(ushort *)&objects[obj->otyp].field_0x11 & 0xc) == 4) {
      dx_00 = '\0';
      dz_00 = '\0';
      dy_00 = '\0';
    }
    else {
      iVar2 = getdir((char *)0x0,&local_129,&local_12a,&local_12b);
      dx_00 = local_129;
      dz_00 = local_12b;
      dy_00 = local_12a;
      if (iVar2 == 0) {
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0029403a;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00294035;
        }
        else {
LAB_00294035:
          if (ublindf == (obj *)0x0) goto LAB_00294081;
LAB_0029403a:
          if (ublindf->oartifact != '\x1d') goto LAB_00294081;
        }
        pcVar4 = xname(obj);
        pcVar4 = The(pcVar4);
        pline("%s glows and fades.",pcVar4);
        goto LAB_00294081;
      }
    }
    if (((dx_00 == '\0' && dy_00 == '\0') && dz_00 == '\0') &&
       ((*(ushort *)&objects[obj->otyp].field_0x11 & 0xc) != 4)) {
      iVar2 = zapyourself(obj,'\x01');
      if (iVar2 != 0) {
        sprintf(local_128,"zapped %sself with a wand",
                *(undefined8 *)
                 ((long)&genders[0].him + (ulong)((uint)(flags.female != '\0') * 0x30)));
        losehp(iVar2,local_128,2);
      }
    }
    else {
      current_wand = obj;
      weffects(obj,dx_00,dy_00,dz_00);
      obj = current_wand;
      current_wand = (obj *)0x0;
      if (obj == (obj *)0x0) goto LAB_002940af;
    }
  }
LAB_00294081:
  if (obj->spe < '\0') {
    pcVar4 = Tobjnam(obj,"turn");
    pline("%s to dust.",pcVar4);
    useup(obj);
  }
LAB_002940af:
  update_inventory();
  return 1;
}

Assistant:

int dozap(struct obj *obj)
{
	int	damage;
	schar dx = 0, dy = 0, dz = 0;

	if (check_capacity(NULL)) return 0;
	
	if (obj && !validate_object(obj, zap_syms, "zap"))
		return 0;
	else if (!obj)
		obj = getobj(zap_syms, "zap", NULL);
	if (!obj) return 0;

	check_unpaid(obj);

	/* zappable addition done by GAN 11/03/86 */
	if (!zappable(obj)) { /* zappable prints the message itself */ }
	/* PM 2008-04-16: 50% chance of blowing up, if zapped 20 times.
	 * Same probability as in muse.c precheck() for monsters. */
	else if (obj->cursed && !rn2(30)) {
		backfire(obj);	/* the wand blows up in your face! */
		exercise(A_STR, FALSE);
		return 1;
	} else if (!(objects[obj->otyp].oc_dir == NODIR) &&
	           !getdir(NULL, &dx, &dy, &dz)) {
		if (!Blind)
		    pline("%s glows and fades.", The(xname(obj)));
		/* make him pay for knowing !NODIR */
	} else if (!dx && !dy && !dz && !(objects[obj->otyp].oc_dir == NODIR)) {
	    if ((damage = zapyourself(obj, TRUE)) != 0) {
		char buf[BUFSZ];
		sprintf(buf, "zapped %sself with a wand", uhim());
		losehp(damage, buf, NO_KILLER_PREFIX);
	    }
	} else {

		/*	Are we having fun yet?
		 * weffects -> buzz(obj->otyp) -> zhitm (temple priest) ->
		 * attack -> hitum -> known_hitum -> ghod_hitsu ->
		 * buzz(AD_ELEC) -> destroy_item(WAND_CLASS) ->
		 * useup -> obfree -> dealloc_obj -> free(obj)
		 */
		current_wand = obj;
		weffects(obj, dx, dy, dz);
		obj = current_wand;
		current_wand = 0;
	}
	if (obj && obj->spe < 0) {
	    pline("%s to dust.", Tobjnam(obj, "turn"));
	    useup(obj);
	}
	update_inventory();	/* maybe used a charge */
	return 1;
}